

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O1

void __thiscall push_marker_options_t::~push_marker_options_t(push_marker_options_t *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->media_string_)._M_dataplus._M_p;
  paVar2 = &(this->media_string_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->init_string_)._M_dataplus._M_p;
  paVar2 = &(this->init_string_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->url_)._M_dataplus._M_p;
  paVar2 = &(this->url_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

push_marker_options_t()
        : url_("http://localhost/test01/test01.isml")
        , dry_run_(false)
        , avail_interval_(60000)
        , avail_dur_(10000)
        , seg_dur_(2000)
        , timescale_(1000)
        , track_id_(1)
        , announce_(0)
        , send_vtt_(false)
        , send_event_(true)
        , media_string_("")
        , init_string_("")
        , splice_immediate_(false)
    {
    }